

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpcpp.hpp
# Opt level: O3

string * __thiscall
jsonrpcpp::Entity::type_str_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  entity_t eVar1;
  char *pcVar2;
  char *pcVar3;
  
  eVar1 = this->entity;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(eVar1) {
  default:
    pcVar3 = "unknown";
    pcVar2 = "";
    break;
  case exception:
    pcVar3 = "exception";
    pcVar2 = "";
    break;
  case id:
    pcVar3 = "id";
    pcVar2 = "";
    break;
  case error:
    pcVar3 = "error";
    pcVar2 = "";
    break;
  case response:
    pcVar3 = "response";
    pcVar2 = "";
    break;
  case request:
    pcVar3 = "request";
    pcVar2 = "";
    break;
  case notification:
    pcVar3 = "notification";
    pcVar2 = "";
    break;
  case batch:
    pcVar3 = "batch";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Entity::type_str() const
{
    switch (entity)
    {
        case entity_t::unknown:
            return "unknown";
        case entity_t::id:
            return "id";
        case entity_t::exception:
            return "exception";
        case entity_t::error:
            return "error";
        case entity_t::response:
            return "response";
        case entity_t::request:
            return "request";
        case entity_t::notification:
            return "notification";
        case entity_t::batch:
            return "batch";
        default:
            return "unknown";
    }
}